

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read.c
# Opt level: O1

int test(LIBSSH2_SESSION *session)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  char remote_command [256];
  char buf [1024];
  char local_538 [256];
  char local_438 [1032];
  
  iVar2 = openssh_fixture_have_docker();
  if (iVar2 == 0) {
    username = getenv("USER");
  }
  pcVar4 = username;
  sVar3 = strlen(username);
  pcVar4 = (char *)libssh2_userauth_list(session,pcVar4,sVar3 & 0xffffffff);
  if (pcVar4 == (char *)0x0) {
    pcVar4 = "libssh2_userauth_list";
LAB_001027f0:
    print_last_session_error(pcVar4);
    return 1;
  }
  pcVar5 = strstr(pcVar4,"publickey");
  pcVar1 = username;
  if (pcVar5 == (char *)0x0) {
    fprintf(_stderr,"\'publickey\' was expected in userauth list: %s\n",pcVar4);
    return 1;
  }
  sVar3 = strlen(username);
  pcVar4 = srcdir_path("key_rsa.pub");
  pcVar5 = srcdir_path("key_rsa");
  iVar2 = libssh2_userauth_publickey_fromfile_ex(session,pcVar1,sVar3 & 0xffffffff,pcVar4,pcVar5,0);
  if (iVar2 != 0) {
    pcVar4 = "libssh2_userauth_publickey_fromfile_ex";
    goto LAB_001027f0;
  }
  lVar6 = libssh2_channel_open_ex(session,"session",7,0x200000,0x8000,0,0);
  if (lVar6 == 0) {
    test_cold_4();
    lVar9 = 0x22330;
  }
  else {
    pcVar4 = getenv("FIXTURE_XFER_COUNT");
    lVar9 = 0x22330;
    if (pcVar4 != (char *)0x0) {
      lVar9 = strtol(pcVar4,(char **)0x0,0);
      fprintf(_stderr,"Custom xfer_count: %lu\n",lVar9);
    }
    snprintf(local_538,0x100,"dd if=/dev/zero bs=%lu count=%lu status=none",0x3e5,lVar9);
    sVar3 = strlen(local_538);
    iVar2 = libssh2_channel_process_startup(lVar6,"exec",4,local_538,sVar3 & 0xffffffff);
    if (iVar2 == 0) {
      iVar2 = libssh2_channel_eof(lVar6);
      if (iVar2 == 0) {
        lVar11 = 0;
        do {
          uVar7 = libssh2_channel_read_ex(lVar6,0,local_438,0x400);
          if ((long)uVar7 < 0) {
            fprintf(_stderr,"Unable to read response: %ld\n",uVar7);
          }
          else {
            if (uVar7 == 0) {
              uVar10 = 0;
            }
            else {
              uVar8 = 1;
              uVar10 = 0;
              do {
                if (local_438[uVar10] != '\0') {
                  test_cold_2();
                  break;
                }
                uVar10 = (ulong)uVar8;
                uVar8 = uVar8 + 1;
              } while (uVar10 < uVar7);
            }
            lVar11 = lVar11 + uVar10;
          }
          iVar2 = libssh2_channel_eof(lVar6);
        } while (iVar2 == 0);
      }
      else {
        lVar11 = 0;
      }
      iVar2 = libssh2_channel_close(lVar6);
      if (iVar2 != 0) {
        test_cold_3();
      }
      libssh2_channel_free(lVar6);
      goto LAB_001028c2;
    }
    test_cold_1();
  }
  lVar11 = 0;
LAB_001028c2:
  if (lVar11 != lVar9 * 0x3e5) {
    fprintf(_stderr,"Not enough bytes received: %lu not %lu\n",lVar11);
    return 1;
  }
  return 0;
}

Assistant:

int test(LIBSSH2_SESSION *session)
{
    int rc;
    unsigned long xfer_bytes = 0;
    LIBSSH2_CHANNEL *channel;

    /* Size and number of blocks to transfer
     * This needs to be large to increase the chance of timing effects causing
     * different code paths to be hit in the unframing code, but not so long
     * that the integration tests take too long. 5 seconds of run time is
     * probably a reasonable compromise. The block size is an odd number to
     * increase the chance that various internal buffer and block boundaries
     * are overlapped. */
    const unsigned long xfer_bs = 997;
    unsigned long xfer_count = 140080;

    char remote_command[256];
    const char *env;
    const char *userauth_list;

    /* Ignore our hard-wired Dockerfile user when not running under Docker */
    if(!openssh_fixture_have_docker()) {
        username = getenv("USER");
#ifdef _WIN32
        if(!username)
            username = getenv("USERNAME");
#endif
    }

    userauth_list = libssh2_userauth_list(session, username,
                                          (unsigned int)strlen(username));
    if(!userauth_list) {
        print_last_session_error("libssh2_userauth_list");
        return 1;
    }

    if(!strstr(userauth_list, "publickey")) {
        fprintf(stderr, "'publickey' was expected in userauth list: %s\n",
                userauth_list);
        return 1;
    }

    rc = libssh2_userauth_publickey_fromfile_ex(session, username,
                                                (unsigned int)strlen(username),
                                                srcdir_path(key_file_public),
                                                srcdir_path(key_file_private),
                                                NULL);
    if(rc) {
        print_last_session_error("libssh2_userauth_publickey_fromfile_ex");
        return 1;
    }

    /* Request a session channel on which to run a shell */
    channel = libssh2_channel_open_session(session);
    if(!channel) {
        fprintf(stderr, "Unable to open a session\n");
        goto shutdown;
    }

    env = getenv("FIXTURE_XFER_COUNT");
    if(env) {
        xfer_count = (unsigned long)strtol(env, NULL, 0);
        fprintf(stderr, "Custom xfer_count: %lu\n", xfer_count);
    }

    /* command to transfer the desired amount of data */
    snprintf(remote_command, sizeof(remote_command),
             "dd if=/dev/zero bs=%lu count=%lu status=none",
             xfer_bs, xfer_count);

    /* Send the command to transfer data */
    if(libssh2_channel_exec(channel, remote_command)) {
        fprintf(stderr, "Unable to request command on channel\n");
        goto shutdown;
    }

    /* Read data */
    while(!libssh2_channel_eof(channel)) {
        char buf[1024];
        ssize_t err = libssh2_channel_read(channel, buf, sizeof(buf));
        if(err < 0)
            fprintf(stderr, "Unable to read response: %ld\n", (long)err);
        else {
            unsigned int i;
            for(i = 0; i < (unsigned long)err; ++i) {
                if(buf[i]) {
                    fprintf(stderr, "Bad data received\n");
                    /* Test will fail below due to bad data length */
                    break;
                }
            }
            xfer_bytes += i;
        }
    }

    /* Shut down */
    if(libssh2_channel_close(channel))
        fprintf(stderr, "Unable to close channel\n");

    if(channel) {
        libssh2_channel_free(channel);
        channel = NULL;
    }

shutdown:

    /* Test check */
    if(xfer_bytes != xfer_count * xfer_bs) {
        fprintf(stderr, "Not enough bytes received: %lu not %lu\n",
                xfer_bytes, xfer_count * xfer_bs);
        return 1;  /* error */
    }
    return 0;
}